

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O2

primitive_dictionary_entry_t * __thiscall
duckdb::
PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
::Lookup(PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
         *this,interval_t *value)

{
  bool bVar1;
  hash_t hVar2;
  int64_t in_RDX;
  primitive_dictionary_entry_t *ppVar3;
  ulong uVar4;
  interval_t val;
  
  val.micros = in_RDX;
  val._0_8_ = value->micros;
  hVar2 = Hash<duckdb::interval_t>(*(duckdb **)value,val);
  do {
    uVar4 = hVar2 & this->capacity_mask;
    ppVar3 = this->dictionary;
    if (ppVar3[uVar4].index == 0xffffffff) {
LAB_01f1e163:
      return ppVar3 + uVar4;
    }
    bVar1 = interval_t::operator!=(&ppVar3[uVar4].value,value);
    if (!bVar1) {
      ppVar3 = this->dictionary;
      goto LAB_01f1e163;
    }
    hVar2 = uVar4 + 1;
  } while( true );
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}